

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node_struct *root,char_t *indent,uint flags,
               uint depth)

{
  uint uVar1;
  size_t indent_length;
  xml_node_struct *pxVar2;
  char cVar3;
  ulong uVar4;
  size_t sVar5;
  xml_node_struct *node;
  byte bVar6;
  char *data;
  bool bVar7;
  
  cVar3 = (char)((flags & 4) >> 2);
  if (cVar3 == '\0' && (flags & 0x41) != 0) {
    indent_length = strlength(indent);
  }
  else {
    indent_length = 0;
  }
  bVar6 = 2;
  bVar7 = false;
  node = root;
  do {
    if (node == (xml_node_struct *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x108a,
                    "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, xml_node_struct *, const char_t *, unsigned int, unsigned int)"
                   );
    }
    if (((uint)node->header & 0xf) - 3 < 2) {
      node_output_simple(writer,node,flags);
      bVar6 = 0;
      bVar7 = false;
LAB_0017ee5c:
      while ((pxVar2 = node, node != root &&
             (pxVar2 = node->next_sibling, pxVar2 == (xml_node_struct *)0x0))) {
        node = node->parent;
        if ((node->header & 0xf) == 2) {
          if (bVar7 && cVar3 == '\0') {
            uVar4 = writer->bufsize;
            if (0x7ff < uVar4) {
              xml_buffered_writer::flush(writer,writer->buffer,uVar4);
              uVar4 = 0;
            }
            writer->buffer[uVar4] = '\n';
            writer->bufsize = uVar4 + 1;
          }
          depth = depth - 1;
          data = node->name;
          if (data == (char_t *)0x0) {
            data = ":anonymous";
          }
LAB_0017eef6:
          uVar4 = writer->bufsize;
          if (0x7fe < uVar4) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar4);
            uVar4 = 0;
          }
          (writer->buffer + uVar4)[0] = '<';
          (writer->buffer + uVar4)[1] = '/';
          sVar5 = uVar4 + 2;
LAB_0017ef1d:
          writer->bufsize = sVar5;
          xml_buffered_writer::write_string(writer,data);
          uVar4 = writer->bufsize;
          if (0x7ff < uVar4) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar4);
            uVar4 = 0;
          }
          writer->buffer[uVar4] = '>';
          sVar5 = uVar4 + 1;
LAB_0017ef53:
          writer->bufsize = sVar5;
LAB_0017ef5a:
          bVar6 = 3;
          bVar7 = true;
        }
      }
    }
    else {
      if (((flags & 4) == 0) && (bVar7)) {
        uVar4 = writer->bufsize;
        if (0x7ff < uVar4) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar4);
          uVar4 = 0;
        }
        writer->buffer[uVar4] = '\n';
        writer->bufsize = uVar4 + 1;
      }
      if ((indent_length != 0) && ((bVar6 & 2) != 0)) {
        text_output_indent(writer,indent,indent_length,depth);
      }
      uVar1 = (uint)node->header & 0xf;
      if (uVar1 == 1) {
        pxVar2 = node->first_child;
        bVar6 = 2;
        bVar7 = false;
        if (pxVar2 == (xml_node_struct *)0x0) goto LAB_0017ee5c;
      }
      else {
        if (uVar1 != 2) {
          node_output_simple(writer,node,flags);
          goto LAB_0017ef5a;
        }
        data = node->name;
        if (data == (char_t *)0x0) {
          data = ":anonymous";
        }
        uVar4 = writer->bufsize;
        if (0x7ff < uVar4) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar4);
          uVar4 = 0;
        }
        writer->buffer[uVar4] = '<';
        writer->bufsize = uVar4 + 1;
        xml_buffered_writer::write_string(writer,data);
        if (node->first_attribute != (xml_attribute_struct *)0x0) {
          node_output_attributes(writer,node,indent,indent_length,flags,depth);
        }
        if (node->value == (char_t *)0x0) {
          uVar4 = writer->bufsize;
          if (node->first_child == (xml_node_struct *)0x0) {
            if (-1 < (char)flags) {
              if ((flags & 4) == 0) {
                if (0x7ff < uVar4) {
                  xml_buffered_writer::flush(writer,writer->buffer,uVar4);
                  uVar4 = 0;
                }
                writer->buffer[uVar4] = ' ';
                uVar4 = uVar4 + 1;
                writer->bufsize = uVar4;
              }
              if (0x7fe < uVar4) {
                xml_buffered_writer::flush(writer,writer->buffer,uVar4);
                uVar4 = 0;
              }
              (writer->buffer + uVar4)[0] = '/';
              (writer->buffer + uVar4)[1] = '>';
              sVar5 = uVar4 + 2;
              goto LAB_0017ef53;
            }
            if (0x7fd < uVar4) {
              xml_buffered_writer::flush(writer,writer->buffer,uVar4);
              uVar4 = 0;
            }
            (writer->buffer + uVar4)[0] = '>';
            (writer->buffer + uVar4)[1] = '<';
            writer->buffer[uVar4 + 2] = '/';
            sVar5 = uVar4 + 3;
            goto LAB_0017ef1d;
          }
          if (0x7ff < uVar4) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar4);
            uVar4 = 0;
          }
          writer->buffer[uVar4] = '>';
          writer->bufsize = uVar4 + 1;
          pxVar2 = node->first_child;
        }
        else {
          uVar4 = writer->bufsize;
          if (0x7ff < uVar4) {
            xml_buffered_writer::flush(writer,writer->buffer,uVar4);
            uVar4 = 0;
          }
          writer->buffer[uVar4] = '>';
          writer->bufsize = uVar4 + 1;
          text_output(writer,node->value,ctx_special_pcdata,flags);
          pxVar2 = node->first_child;
          if (pxVar2 == (xml_node_struct *)0x0) goto LAB_0017eef6;
        }
        bVar7 = node->value == (char_t *)0x0;
        bVar6 = bVar7 * '\x03';
        depth = depth + 1;
      }
    }
    node = pxVar2;
    if (pxVar2 == root) {
      if (((flags & 4) == 0) && (bVar7)) {
        uVar4 = writer->bufsize;
        if (0x7ff < uVar4) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar4);
          uVar4 = 0;
        }
        writer->buffer[uVar4] = '\n';
        writer->bufsize = uVar4 + 1;
      }
      return;
    }
  } while( true );
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, xml_node_struct* root, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		size_t indent_length = ((flags & (format_indent | format_indent_attributes)) && (flags & format_raw) == 0) ? strlength(indent) : 0;
		unsigned int indent_flags = indent_indent;

		xml_node_struct* node = root;

		do
		{
			assert(node);

			// begin writing current node
			if (PUGI__NODETYPE(node) == node_pcdata || PUGI__NODETYPE(node) == node_cdata)
			{
				node_output_simple(writer, node, flags);

				indent_flags = 0;
			}
			else
			{
				if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
					writer.write('\n');

				if ((indent_flags & indent_indent) && indent_length)
					text_output_indent(writer, indent, indent_length, depth);

				if (PUGI__NODETYPE(node) == node_element)
				{
					indent_flags = indent_newline | indent_indent;

					if (node_output_start(writer, node, indent, indent_length, flags, depth))
					{
						// element nodes can have value if parse_embed_pcdata was used
						if (node->value)
							indent_flags = 0;

						node = node->first_child;
						depth++;
						continue;
					}
				}
				else if (PUGI__NODETYPE(node) == node_document)
				{
					indent_flags = indent_indent;

					if (node->first_child)
					{
						node = node->first_child;
						continue;
					}
				}
				else
				{
					node_output_simple(writer, node, flags);

					indent_flags = indent_newline | indent_indent;
				}
			}

			// continue to the next node
			while (node != root)
			{
				if (node->next_sibling)
				{
					node = node->next_sibling;
					break;
				}

				node = node->parent;

				// write closing node
				if (PUGI__NODETYPE(node) == node_element)
				{
					depth--;

					if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
						writer.write('\n');

					if ((indent_flags & indent_indent) && indent_length)
						text_output_indent(writer, indent, indent_length, depth);

					node_output_end(writer, node);

					indent_flags = indent_newline | indent_indent;
				}
			}
		}
		while (node != root);

		if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
			writer.write('\n');
	}